

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

void run_the_test_code(TestSuite *suite,CgreenTest *spec,TestReporter *reporter)

{
  _Bool _Var1;
  uint seconds;
  char *pcVar2;
  _func_void *p_Var3;
  
  significant_figures_for_assert_double_are(8);
  clear_mocks();
  pcVar2 = getenv("CGREEN_PER_TEST_TIMEOUT");
  if (pcVar2 != (char *)0x0) {
    validate_per_test_timeout_value();
    seconds = per_test_timeout_value();
    die_in(seconds);
  }
  _Var1 = has_setup(suite);
  if (_Var1) {
    p_Var3 = suite->setup;
LAB_0010c2bb:
    (*p_Var3)();
  }
  else {
    p_Var3 = spec->context->setup;
    if (p_Var3 != (_func_void *)0x0) goto LAB_0010c2bb;
  }
  current_test = spec;
  (*spec->run)();
  _Var1 = has_teardown(suite);
  if (_Var1) {
    p_Var3 = suite->teardown;
  }
  else {
    p_Var3 = spec->context->teardown;
    if (p_Var3 == (_func_void *)0x0) goto LAB_0010c2ec;
  }
  (*p_Var3)();
LAB_0010c2ec:
  tally_mocks(reporter);
  return;
}

Assistant:

void run_the_test_code(TestSuite *suite, CgreenTest *spec, TestReporter *reporter)
{
    significant_figures_for_assert_double_are(8);
    clear_mocks();

    if (per_test_timeout_defined())
    {
        validate_per_test_timeout_value();

        die_in(per_test_timeout_value());
    }

    // for historical reasons the suite can have a setup
    if (has_setup(suite))
    {
        (*suite->setup)();
    }
    else
    {
        if (spec->context->setup != NULL)
        {
            run_setup_for(spec);
        }
    }

    run(spec);
    // for historical reasons the suite can have a teardown
    if (has_teardown(suite))
    {
        (*suite->teardown)();
    }
    else
    {
        if (spec->context->teardown != NULL)
        {
            run_teardown_for(spec);
        }
    }

    tally_mocks(reporter);
}